

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatcher.cpp
# Opt level: O1

void __thiscall cppnet::Dispatcher::StopTimer(Dispatcher *this,uint32_t timer_id)

{
  int *piVar1;
  long lVar2;
  long *plVar3;
  element_type *peVar4;
  ulong uVar5;
  int iVar6;
  pthread_t pVar7;
  ulong uVar8;
  long *plVar9;
  long *plVar10;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::TimerEvent>_>,_false>
  __it;
  long *in_FS_OFFSET;
  long local_58;
  long *local_50;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  uVar5 = (ulong)timer_id;
  pVar7 = pthread_self();
  if (pVar7 == (this->_local_thread_id)._M_thread) {
    __all_timer_event_map::__tls_init();
    lVar2 = *in_FS_OFFSET;
    uVar8 = uVar5 % (ulong)in_FS_OFFSET[-0x17];
    plVar9 = *(long **)(in_FS_OFFSET[-0x18] + uVar8 * 8);
    plVar10 = (long *)0x0;
    if ((plVar9 != (long *)0x0) &&
       (plVar3 = (long *)*plVar9, plVar10 = plVar9, ((long *)*plVar9)[1] != uVar5)) {
      while (plVar9 = plVar3, plVar3 = (long *)*plVar9, plVar3 != (long *)0x0) {
        plVar10 = (long *)0x0;
        if (((ulong)plVar3[1] % (ulong)in_FS_OFFSET[-0x17] != uVar8) ||
           (plVar10 = plVar9, plVar3[1] == uVar5)) goto LAB_0010a6b4;
      }
      plVar10 = (long *)0x0;
    }
LAB_0010a6b4:
    if (plVar10 == (long *)0x0) {
      __it._M_cur = (__node_type *)0x0;
    }
    else {
      __it._M_cur = (__node_type *)*plVar10;
    }
    __all_timer_event_map::__tls_init();
    if (__it._M_cur != (__node_type *)0x0) {
      peVar4 = (this->_timer).super___shared_ptr<cppnet::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_58 = *(long *)((long)__it._M_cur + 0x10) + 0x28;
      if (*(long *)((long)__it._M_cur + 0x10) == 0) {
        local_58 = 0;
      }
      local_50 = *(long **)((long)__it._M_cur + 0x18);
      if (local_50 != (long *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)((long)local_50 + 0xc) = *(int *)((long)local_50 + 0xc) + 1;
          UNLOCK();
        }
        else {
          *(int *)((long)local_50 + 0xc) = *(int *)((long)local_50 + 0xc) + 1;
        }
      }
      (*peVar4->_vptr_Timer[1])(peVar4,&local_58);
      if (local_50 != (long *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          piVar1 = (int *)((long)local_50 + 0xc);
          iVar6 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
        }
        else {
          iVar6 = *(int *)((long)local_50 + 0xc);
          *(int *)((long)local_50 + 0xc) = iVar6 + -1;
        }
        if (iVar6 == 1) {
          (**(code **)(*local_50 + 0x18))();
        }
      }
      __all_timer_event_map::__tls_init();
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<cppnet::TimerEvent>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::TimerEvent>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::erase((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<cppnet::TimerEvent>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::TimerEvent>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)(lVar2 + -0xc0),(const_iterator)__it._M_cur);
    }
  }
  else {
    local_48._4_4_ = 0;
    local_48._0_4_ = timer_id;
    pcStack_30 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/dispatcher.cpp:186:21)>
                 ::_M_invoke;
    local_38 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/dispatcher.cpp:186:21)>
               ::_M_manager;
    local_48._8_8_ = this;
    PostTask(this,(Task *)&local_48);
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
  }
  return;
}

Assistant:

void Dispatcher::StopTimer(uint32_t timer_id) {
    if (std::this_thread::get_id() == _local_thread_id) {
        auto iter = __all_timer_event_map.find(timer_id);
        if (iter == __all_timer_event_map.end()) {
            return;
        }
        
        _timer->RmTimer(iter->second);
        __all_timer_event_map.erase(iter);

    } else {
        auto task = [timer_id, this]() {
            auto iter = __all_timer_event_map.find(timer_id);
            if (iter == __all_timer_event_map.end()) {
                return;
            }

            _timer->RmTimer(iter->second);
            __all_timer_event_map.erase(iter);
        };
        PostTask(task);
    }
}